

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StripEH.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_150::StripEHImpl::visitFunction(StripEHImpl *this,Function *curr)

{
  Function *func;
  Module *module;
  ReFinalize local_180;
  Function *local_18;
  Function *curr_local;
  StripEHImpl *this_local;
  
  if ((this->refinalize & 1U) != 0) {
    local_18 = curr;
    curr_local = (Function *)this;
    ReFinalize::ReFinalize(&local_180);
    func = local_18;
    module = Walker<wasm::(anonymous_namespace)::StripEHImpl,_wasm::Visitor<wasm::(anonymous_namespace)::StripEHImpl,_void>_>
             ::getModule(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::StripEHImpl,_wasm::Visitor<wasm::(anonymous_namespace)::StripEHImpl,_void>_>_>
                          ).
                          super_PostWalker<wasm::(anonymous_namespace)::StripEHImpl,_wasm::Visitor<wasm::(anonymous_namespace)::StripEHImpl,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::StripEHImpl,_wasm::Visitor<wasm::(anonymous_namespace)::StripEHImpl,_void>_>
                        );
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              (&local_180.
                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                .
                super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
               func,module);
    ReFinalize::~ReFinalize(&local_180);
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
    if (refinalize) {
      ReFinalize().walkFunctionInModule(curr, getModule());
    }
  }